

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppLogger.cpp
# Opt level: O0

CppLogger * __thiscall
CppLogger::CppLogger::printFormat(CppLogger *this,Level t_Level,string *t_Message)

{
  bool bVar1;
  tm *__tp;
  ostream *poVar2;
  string *in_RCX;
  undefined4 in_register_00000034;
  char local_f8 [8];
  char time [100];
  tm *currTm;
  time_t currTime;
  FormatAttribute *attribute;
  iterator __end1;
  iterator __begin1;
  vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *__range1;
  undefined1 local_40 [8];
  vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> format;
  string *t_Message_local;
  Level t_Level_local;
  CppLogger *this_local;
  stringstream *sstr;
  
  Format::getFormat((vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                     *)local_40,
                    (Format *)
                    (CONCAT44(in_register_00000034,t_Level) + 0x28 +
                    (long)((int)t_Message + -1) * 0x18));
  std::__cxx11::stringstream::stringstream((stringstream *)this);
  __end1 = std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::
           begin((vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *)
                 local_40);
  attribute = (FormatAttribute *)
              std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::
              end((vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *
                  )local_40);
  while (bVar1 = __gnu_cxx::
                 operator==<CppLogger::FormatAttribute_*,_std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>_>
                           (&__end1,(__normal_iterator<CppLogger::FormatAttribute_*,_std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>_>
                                     *)&attribute), ((bVar1 ^ 0xffU) & 1) != 0) {
    currTime = (time_t)__gnu_cxx::
                       __normal_iterator<CppLogger::FormatAttribute_*,_std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>_>
                       ::operator*(&__end1);
    switch(*(FormatAttribute *)currTime) {
    case None:
      break;
    case Name:
      poVar2 = std::operator<<((ostream *)&(this->m_Name)._M_string_length,"[");
      poVar2 = std::operator<<(poVar2,(string *)(CONCAT44(in_register_00000034,t_Level) + 8));
      std::operator<<(poVar2,"] ");
      break;
    case Time:
      ::time((time_t *)&currTm);
      __tp = localtime((time_t *)&currTm);
      strftime(local_f8,0x32,"%T",__tp);
      poVar2 = std::operator<<((ostream *)&(this->m_Name)._M_string_length,local_f8);
      std::operator<<(poVar2," ");
      break;
    case Level:
      switch((ulong)t_Message & 0xffffffff) {
      case 0:
        break;
      case 1:
        std::operator<<((ostream *)&(this->m_Name)._M_string_length,"(Trace) ");
        break;
      case 2:
        std::operator<<((ostream *)&(this->m_Name)._M_string_length,"(Info) ");
        break;
      case 3:
        std::operator<<((ostream *)&(this->m_Name)._M_string_length,"(Warn) ");
        break;
      case 4:
        std::operator<<((ostream *)&(this->m_Name)._M_string_length,"(Error) ");
        break;
      case 5:
        std::operator<<((ostream *)&(this->m_Name)._M_string_length,"(Fatal Error) ");
      }
      break;
    case Message:
      poVar2 = std::operator<<((ostream *)&(this->m_Name)._M_string_length,in_RCX);
      std::operator<<(poVar2," ");
    }
    __gnu_cxx::
    __normal_iterator<CppLogger::FormatAttribute_*,_std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>_>
    ::operator++(&__end1);
  }
  std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::~vector
            ((vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *)
             local_40);
  return this;
}

Assistant:

std::stringstream CppLogger::printFormat(Level t_Level, std::string t_Message) {
        std::vector<FormatAttribute > format = m_Format[t_Level - 1].getFormat();
        std::stringstream sstr;
        for (const auto &attribute : format) {
            switch (attribute) {
                case FormatAttribute::None:
                    break;
                case FormatAttribute::Name:
                    sstr << "[" << m_Name << "] ";
                    break;
                case FormatAttribute::Time: {
                    std::time_t currTime;
                    std::tm * currTm;
                    std::time(&currTime);
                    currTm = std::localtime(&currTime);

                    char time[100];
                    std::strftime(time, 50, "%T", currTm);
                    sstr << time << " ";
                    break;
                }
                case FormatAttribute::Level: {
                    switch (t_Level) {
                        case None:
                            break;
                        case Trace:
                            sstr << "(Trace) ";
                            break;
                        case Info:
                            sstr << "(Info) ";
                            break;
                        case Warn:
                            sstr << "(Warn) ";
                            break;
                        case Error:
                            sstr << "(Error) ";
                            break;
                        case FatalError:
                            sstr << "(Fatal Error) ";
                            break;
                    }
                    break;
                }
                case FormatAttribute::Message:
                    sstr << t_Message << " ";
                    break;
            }
        }
        return sstr;
    }